

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

double llvm::detail::scalbn(double __x,int __n)

{
  fltSemantics *pfVar1;
  roundingMode in_ECX;
  int in_EDX;
  IEEEFloat *in_RSI;
  undefined4 in_register_0000003c;
  int iVar2;
  int iVar3;
  double extraout_XMM0_Qa;
  
  pfVar1 = in_RSI->semantics;
  iVar2 = ~(int)pfVar1->minExponent + (int)pfVar1->maxExponent;
  iVar3 = (-2 - iVar2) - pfVar1->precision;
  if (iVar3 <= in_EDX) {
    iVar3 = in_EDX;
  }
  iVar2 = pfVar1->precision + iVar2 + 1;
  if (iVar2 < iVar3) {
    iVar3 = iVar2;
  }
  in_RSI->exponent = in_RSI->exponent + (short)iVar3;
  IEEEFloat::normalize(in_RSI,in_ECX,lfExactlyZero);
  if ((in_RSI->field_0x12 & 7) == 1) {
    IEEEFloat::makeQuiet(in_RSI);
  }
  IEEEFloat::IEEEFloat((IEEEFloat *)CONCAT44(in_register_0000003c,__n),in_RSI);
  return extraout_XMM0_Qa;
}

Assistant:

IEEEFloat scalbn(IEEEFloat X, int Exp, IEEEFloat::roundingMode RoundingMode) {
  auto MaxExp = X.getSemantics().maxExponent;
  auto MinExp = X.getSemantics().minExponent;

  // If Exp is wildly out-of-scale, simply adding it to X.exponent will
  // overflow; clamp it to a safe range before adding, but ensure that the range
  // is large enough that the clamp does not change the result. The range we
  // need to support is the difference between the largest possible exponent and
  // the normalized exponent of half the smallest denormal.

  int SignificandBits = X.getSemantics().precision - 1;
  int MaxIncrement = MaxExp - (MinExp - SignificandBits) + 1;

  // Clamp to one past the range ends to let normalize handle overlflow.
  X.exponent += std::min(std::max(Exp, -MaxIncrement - 1), MaxIncrement);
  X.normalize(RoundingMode, lfExactlyZero);
  if (X.isNaN())
    X.makeQuiet();
  return X;
}